

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

DBErrors __thiscall wallet::WalletBatch::LoadWallet(WalletBatch *this,CWallet *pwallet)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  bool bVar10;
  int iVar11;
  DBErrors DVar12;
  LegacyDataSPKM *this_00;
  _Base_ptr p_Var13;
  LegacyScriptPubKeyMan *this_01;
  void *pvVar14;
  LoadResult LVar15;
  LoadResult LVar16;
  LoadResult LVar17;
  iterator iVar18;
  undefined8 uVar19;
  key_type *__k;
  DBErrors DVar20;
  unsigned_long *value;
  long lVar21;
  DBErrors DVar22;
  long *plVar23;
  long in_FS_OFFSET;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int last_client;
  vector<uint256,_std::allocator<uint256>_> upgraded_txs;
  bool any_unordered;
  LoadResult keymeta_res;
  int num_ckeys;
  int num_keys;
  LoadResult ckey_res;
  LoadResult key_res;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  int nMinVersion;
  LoadResult desc_res;
  int local_25c;
  undefined1 local_258 [16];
  long local_248;
  char local_239;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  _Any_data local_190;
  code *local_180;
  code *local_178;
  LoadResult local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  _Any_data local_128;
  code *local_118;
  code *local_110;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  LoadResult local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  unique_lock<std::recursive_mutex> local_b8;
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [8];
  undefined1 local_98 [16];
  _Base_ptr local_88;
  size_t local_80;
  undefined1 auStack_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  _Base_ptr local_48;
  size_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_239 = '\0';
  local_258 = (undefined1  [16])0x0;
  local_248 = 0;
  local_b8._M_device = &(pwallet->cs_wallet).super_recursive_mutex;
  local_b8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b8);
  local_25c = 0x46c6c;
  bVar9 = DatabaseBatch::Read<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DBKeys::VERSION_abi_cxx11_,&local_25c);
  local_a8._0_4_ = CWallet::GetVersion(pwallet);
  CWallet::WalletLogPrintf<int,int>
            (pwallet,(ConstevalFormatString<2U>)0x10eadb2,(int *)local_a8,&local_25c);
  auVar4._12_4_ = 0;
  auVar4._0_12_ = stack0xffffffffffffff5c;
  _local_a8 = (_Any_data)(auVar4 << 0x20);
  bVar10 = DatabaseBatch::Read<std::__cxx11::string,int>
                     ((this->m_batch)._M_t.
                      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                      .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &DBKeys::MINVERSION_abi_cxx11_,(int *)local_a8);
  if (bVar10) {
    if ((int)local_a8._0_4_ < 0x297ad) {
      pwallet->nWalletVersion = local_a8._0_4_;
      goto LAB_00c3a994;
    }
LAB_00c3ae27:
    DVar12 = TOO_NEW;
  }
  else {
LAB_00c3a994:
    value = (unsigned_long *)local_a8;
    bVar10 = DatabaseBatch::Read<std::__cxx11::string,unsigned_long>
                       ((this->m_batch)._M_t.
                        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &DBKeys::FLAGS_abi_cxx11_,value);
    if (bVar10) {
      bVar10 = CWallet::LoadWalletFlags(pwallet,(uint64_t)local_a8);
      if (!bVar10) {
        CWallet::WalletLogPrintf<>(pwallet,(ConstevalFormatString<0U>)0x10eaf73);
        goto LAB_00c3ae27;
      }
    }
    iVar11 = local_25c;
    _Var3._M_head_impl =
         (this->m_batch)._M_t.
         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
         _M_t.
         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
    bVar10 = CWallet::IsWalletFlagSet(pwallet,0x400000000);
    if (bVar10) {
      plVar23 = (long *)(DBKeys::LEGACY_TYPES_abi_cxx11_ + 0x10);
      do {
        plVar23 = (long *)*plVar23;
        if (plVar23 == (long *)0x0) {
          DVar20 = LOAD_OK;
          goto LAB_00c3b100;
        }
        local_98 = (undefined1  [16])0x0;
        _local_a8 = (_Any_data)0x0;
        local_58 = (undefined1  [16])0x0;
        local_68 = (undefined1  [16])0x0;
        local_c8 = (undefined1  [16])0x0;
        local_d8 = (undefined1  [16])0x0;
        Serialize<DataStream,char>
                  ((DataStream *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (plVar23 + 1));
        (*(_Var3._M_head_impl)->_vptr_DatabaseBatch[10])
                  (&local_e0,_Var3._M_head_impl,(_Invoker_type)(local_d8._0_8_ + local_c8._8_8_),
                   local_d8._8_8_ - (long)(local_d8._0_8_ + local_c8._8_8_));
        if (local_e0 == (LoadResult)0x0) {
          CWallet::WalletLogPrintf<std::__cxx11::string>
                    (pwallet,(ConstevalFormatString<1U>)0x10eafbc,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar23 + 1));
          value = (unsigned_long *)0x9;
LAB_00c3ab06:
          bVar10 = false;
        }
        else {
          iVar11 = (**(code **)(*(long *)local_e0 + 0x10))
                             (local_e0,(_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                        *)local_a8,
                              (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                              local_68);
          bVar10 = true;
          if (iVar11 != 2) {
            CWallet::WalletLogPrintf<std::__cxx11::string>
                      (pwallet,(ConstevalFormatString<1U>)0x10eafec,&pwallet->m_name);
            value = (unsigned_long *)&DAT_00000008;
            goto LAB_00c3ab06;
          }
        }
        DVar12 = (DBErrors)value;
        if (local_e0 != (LoadResult)0x0) {
          (**(code **)(*(long *)local_e0 + 8))();
        }
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_d8);
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_68);
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_a8);
      } while (bVar10);
    }
    else {
      local_108 = (_Any_data)0x0;
      local_f0 = std::
                 _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
                 ::_M_invoke;
      local_f8 = std::
                 _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
                 ::_M_manager;
      LVar15 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::HDCHAIN_abi_cxx11_,
                           (LoadFunc *)&local_108);
      if (local_f8 != (code *)0x0) {
        (*local_f8)(&local_108,&local_108,__destroy_functor);
      }
      local_128 = (_Any_data)0x0;
      local_110 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
                  ::_M_invoke;
      local_118 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
                  ::_M_manager;
      LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::KEY_abi_cxx11_,
                           (LoadFunc *)&local_128);
      local_d8._0_4_ = LVar16.m_result;
      local_d8._4_4_ = LVar16.m_records;
      if (local_118 != (code *)0x0) {
        (*local_118)(&local_128,&local_128,__destroy_functor);
      }
      if ((int)LVar16.m_result < (int)LVar15.m_result) {
        LVar16 = LVar15;
      }
      local_148 = (_Any_data)0x0;
      local_130 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                  ::_M_invoke;
      local_138 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                  ::_M_manager;
      LVar15 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_,
                           (LoadFunc *)&local_148);
      local_e0 = LVar15;
      if (local_138 != (code *)0x0) {
        (*local_138)(&local_148,&local_148,__destroy_functor);
      }
      DVar12 = LVar16.m_result;
      if ((int)LVar16.m_result <= (int)LVar15.m_result) {
        DVar12 = LVar15.m_result;
      }
      local_168 = (_Any_data)0x0;
      local_150 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                  ::_M_invoke;
      local_158 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                  ::_M_manager;
      LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::CSCRIPT_abi_cxx11_,
                           (LoadFunc *)&local_168);
      if (local_158 != (code *)0x0) {
        (*local_158)(&local_168,&local_168,__destroy_functor);
      }
      DVar20 = LVar16.m_result;
      if ((int)LVar16.m_result < (int)DVar12) {
        DVar20 = DVar12;
      }
      DVar12 = LOAD_OK;
      if (0 < (int)DVar20) {
        DVar12 = DVar20;
      }
      if ((0 < LVar15.m_records) &&
         (((iVar11 == 50000 || (iVar11 == 40000)) && (DVar12 = NEED_REWRITE, 2 < (int)DVar20)))) {
        DVar12 = DVar20;
      }
      auStack_a0._0_4_ = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (_Base_ptr)auStack_a0;
      local_98 = auVar5 << 0x40;
      local_80 = 0;
      local_190._8_8_ = 0;
      local_178 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
                  ::_M_invoke;
      local_180 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
                  ::_M_manager;
      local_190._M_unused._0_8_ = (undefined8)value;
      local_88 = (_Base_ptr)auStack_a0;
      LVar15 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::KEYMETA_abi_cxx11_,
                           (LoadFunc *)&local_190);
      local_170 = LVar15;
      if (local_180 != (code *)0x0) {
        (*local_180)(&local_190,&local_190,__destroy_functor);
      }
      DVar20 = LVar15.m_result;
      if ((int)LVar15.m_result < (int)DVar12) {
        DVar20 = DVar12;
      }
      if (local_80 != 0) {
        this_00 = CWallet::GetLegacyDataSPKM(pwallet);
        if (this_00 == (LegacyDataSPKM *)0x0) {
          DVar20 = CORRUPT;
          CWallet::WalletLogPrintf<>(pwallet,(ConstevalFormatString<0U>)0x10eb076);
        }
        else {
          for (p_Var13 = (_Base_ptr)local_98._8_8_; p_Var13 != (_Base_ptr)auStack_a0;
              p_Var13 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var13)) {
            auVar24[0] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[0] == (char)p_Var13[1]._M_color);
            auVar24[1] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[1] == *(byte *)((long)&p_Var13[1]._M_color + 1));
            auVar24[2] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[2] == *(byte *)((long)&p_Var13[1]._M_color + 2));
            auVar24[3] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[3] == *(byte *)((long)&p_Var13[1]._M_color + 3));
            auVar24[4] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[4] == p_Var13[1].field_0x4);
            auVar24[5] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[5] == p_Var13[1].field_0x5);
            auVar24[6] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[6] == p_Var13[1].field_0x6);
            auVar24[7] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[7] == p_Var13[1].field_0x7);
            auVar24[8] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[8] == *(uchar *)&p_Var13[1]._M_parent);
            auVar24[9] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[9] == *(uchar *)((long)&p_Var13[1]._M_parent + 1));
            auVar24[10] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data
                            ._M_elems[10] == *(uchar *)((long)&p_Var13[1]._M_parent + 2));
            auVar24[0xb] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xb] == *(uchar *)((long)&p_Var13[1]._M_parent + 3));
            auVar24[0xc] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xc] == *(uchar *)((long)&p_Var13[1]._M_parent + 4));
            auVar24[0xd] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xd] == *(uchar *)((long)&p_Var13[1]._M_parent + 5));
            auVar24[0xe] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xe] == *(uchar *)((long)&p_Var13[1]._M_parent + 6));
            auVar24[0xf] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xf] == *(uchar *)((long)&p_Var13[1]._M_parent + 7));
            uVar1 = *(undefined4 *)&p_Var13[1]._M_left;
            uVar2 = *(undefined4 *)
                     ((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                      _M_elems + 0x10);
            auVar25[0] = -((char)uVar2 == (char)uVar1);
            auVar25[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
            auVar25[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
            auVar25[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
            auVar25[4] = 0xff;
            auVar25[5] = 0xff;
            auVar25[6] = 0xff;
            auVar25[7] = 0xff;
            auVar25[8] = 0xff;
            auVar25[9] = 0xff;
            auVar25[10] = 0xff;
            auVar25[0xb] = 0xff;
            auVar25[0xc] = 0xff;
            auVar25[0xd] = 0xff;
            auVar25[0xe] = 0xff;
            auVar25[0xf] = 0xff;
            auVar25 = auVar25 & auVar24;
            if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff) {
              LegacyDataSPKM::AddInactiveHDChain(this_00,(CHDChain *)&p_Var13[1]._M_right);
            }
          }
        }
      }
      local_1b8 = (_Any_data)0x0;
      local_1a0 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                  ::_M_invoke;
      local_1a8 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                  ::_M_manager;
      LVar15 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::WATCHS_abi_cxx11_,
                           (LoadFunc *)&local_1b8);
      if (local_1a8 != (code *)0x0) {
        (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
      }
      if ((int)DVar20 <= (int)LVar15.m_result) {
        DVar20 = LVar15.m_result;
      }
      local_1d8 = (_Any_data)0x0;
      local_1c0 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                  ::_M_invoke;
      local_1c8 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                  ::_M_manager;
      LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::WATCHMETA_abi_cxx11_,
                           (LoadFunc *)&local_1d8);
      if (local_1c8 != (code *)0x0) {
        (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
      }
      if ((int)DVar20 <= (int)LVar16.m_result) {
        DVar20 = LVar16.m_result;
      }
      local_1f8 = (_Any_data)0x0;
      local_1e0 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                  ::_M_invoke;
      local_1e8 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                  ::_M_manager;
      LVar17 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::POOL_abi_cxx11_,
                           (LoadFunc *)&local_1f8);
      if (local_1e8 != (code *)0x0) {
        (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
      }
      DVar12 = LVar17.m_result;
      if ((int)LVar17.m_result < (int)DVar20) {
        DVar12 = DVar20;
      }
      local_218 = (_Any_data)0x0;
      local_200 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                  ::_M_invoke;
      local_208 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                  ::_M_manager;
      LVar17 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::DEFAULTKEY_abi_cxx11_,
                           (LoadFunc *)&local_218);
      if (local_208 != (code *)0x0) {
        (*local_208)(&local_218,&local_218,__destroy_functor);
      }
      DVar20 = LVar17.m_result;
      if ((int)LVar17.m_result < (int)DVar12) {
        DVar20 = DVar12;
      }
      local_238 = (_Any_data)0x0;
      local_220 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                  ::_M_invoke;
      local_228 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                  ::_M_manager;
      LVar17 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::OLD_KEY_abi_cxx11_,
                           (LoadFunc *)&local_238);
      if (local_228 != (code *)0x0) {
        (*local_228)(&local_238,&local_238,__destroy_functor);
      }
      DVar12 = LVar17.m_result;
      if ((int)LVar17.m_result < (int)DVar20) {
        DVar12 = DVar20;
      }
      if ((int)DVar12 < 5) {
        local_68._0_4_ = local_e0.m_records + local_d8._4_4_;
        CWallet::WalletLogPrintf<int,int,int,int>
                  (pwallet,(ConstevalFormatString<4U>)0x10eb0ae,(int *)(local_d8 + 4),
                   &local_e0.m_records,&local_170.m_records,(int *)local_68);
        bVar10 = CWallet::IsLegacy(pwallet);
        if (bVar10) {
          if ((LVar15.m_records + local_d8._4_4_ + local_e0.m_records !=
               LVar16.m_records + local_170.m_records) &&
             (this_01 = CWallet::GetLegacyScriptPubKeyMan(pwallet),
             this_01 != (LegacyScriptPubKeyMan *)0x0)) {
            local_68[8] = 0;
            local_68._0_8_ =
                 &(this_01->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore;
            std::unique_lock<std::recursive_mutex>::lock
                      ((unique_lock<std::recursive_mutex> *)local_68);
            LegacyScriptPubKeyMan::UpdateTimeFirstKey(this_01,1);
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)local_68);
          }
        }
      }
      std::
      _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
      ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                   *)local_a8);
    }
    DVar20 = LOAD_OK;
    if (0 < (int)DVar12) {
      DVar20 = DVar12;
    }
LAB_00c3b100:
    _Var3._M_head_impl =
         (this->m_batch)._M_t.
         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
         _M_t.
         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
    local_d8._0_4_ = local_25c;
    auVar6._12_4_ = 0;
    auVar6._0_12_ = local_108._4_12_;
    local_108 = (_Any_data)(auVar6 << 0x20);
    auVar7._12_4_ = 0;
    auVar7._0_12_ = local_128._4_12_;
    local_128 = (_Any_data)(auVar7 << 0x20);
    auStack_a0 = (undefined1  [8])0x0;
    pvVar14 = operator_new(0x20);
    *(DatabaseBatch **)pvVar14 = _Var3._M_head_impl;
    *(_Any_data **)((long)pvVar14 + 8) = &local_108;
    *(_Any_data **)((long)pvVar14 + 0x10) = &local_128;
    *(undefined1 **)((long)pvVar14 + 0x18) = local_d8;
    local_a8 = (undefined1  [8])pvVar14;
    local_98._8_8_ =
         std::
         _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
         ::_M_invoke;
    local_98._0_8_ =
         std::
         _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
         ::_M_manager;
    LVar15 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::WALLETDESCRIPTOR_abi_cxx11_,
                         (LoadFunc *)local_a8);
    local_68._0_4_ = LVar15.m_result;
    local_68._4_4_ = LVar15.m_records;
    if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
      (*(code *)local_98._0_8_)(local_a8,local_a8,3);
    }
    DVar12 = LVar15.m_result;
    if ((int)LVar15.m_result < 5) {
      local_148._0_4_ = local_128._0_4_ + local_108._0_4_;
      CWallet::WalletLogPrintf<int,int,int,int>
                (pwallet,(ConstevalFormatString<4U>)0x10eb3db,(int *)(local_68 + 4),
                 (int *)local_108._M_pod_data,(int *)local_128._M_pod_data,
                 (int *)local_148._M_pod_data);
      DVar12 = local_68._0_4_;
    }
    if ((int)DVar20 < (int)DVar12) {
      DVar20 = DVar12;
    }
    DVar12 = UNKNOWN_DESCRIPTOR;
    if (DVar20 != UNKNOWN_DESCRIPTOR) {
      _Var3._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      _local_a8 = (_Any_data)0x0;
      local_98._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
           ::_M_invoke;
      local_98._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
           ::_M_manager;
      LVar15 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::NAME_abi_cxx11_,
                           (LoadFunc *)local_a8);
      if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_98._0_8_)(local_a8,local_a8,3);
      }
      local_68 = (undefined1  [16])0x0;
      local_58._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
           ::_M_invoke;
      local_58._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
           ::_M_manager;
      LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::PURPOSE_abi_cxx11_,
                           (LoadFunc *)local_68);
      if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_58._0_8_)(local_68,local_68,3);
      }
      local_d8 = (undefined1  [16])0x0;
      local_c8._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
           ::_M_invoke;
      local_c8._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
           ::_M_manager;
      LVar17 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::DESTDATA_abi_cxx11_,
                           (LoadFunc *)local_d8);
      if ((_Manager_type)local_c8._0_8_ != (_Manager_type)0x0) {
        (*(code *)local_c8._0_8_)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
      }
      DVar12 = LVar16.m_result;
      if ((int)LVar16.m_result < (int)LVar15.m_result) {
        DVar12 = LVar15.m_result;
      }
      if ((int)DVar12 <= (int)LVar17.m_result) {
        DVar12 = LVar17.m_result;
      }
      DVar22 = LOAD_OK;
      if (0 < (int)DVar12) {
        DVar22 = DVar12;
      }
      if (DVar22 <= DVar20) {
        DVar22 = DVar20;
      }
      _Var3._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      local_239 = '\0';
      auStack_a0 = (undefined1  [8])local_258;
      local_a8 = (undefined1  [8])&local_239;
      local_98._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
           ::_M_invoke;
      local_98._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
           ::_M_manager;
      LVar15 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::TX_abi_cxx11_,
                           (LoadFunc *)local_a8);
      if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_98._0_8_)(local_a8,local_a8,3);
      }
      local_68 = (undefined1  [16])0x0;
      local_58._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
           ::_M_invoke;
      local_58._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
           ::_M_manager;
      LVar16 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::LOCKED_UTXO_abi_cxx11_,
                           (LoadFunc *)local_68);
      if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_58._0_8_)(local_68,local_68,3);
      }
      local_d8 = (undefined1  [16])0x0;
      local_c8._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
           ::_M_invoke;
      local_c8._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
           ::_M_manager;
      LVar17 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)&DBKeys::ORDERPOSNEXT_abi_cxx11_,
                           (LoadFunc *)local_d8);
      if ((_Manager_type)local_c8._0_8_ != (_Manager_type)0x0) {
        (*(code *)local_c8._0_8_)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
      }
      DVar20 = LVar16.m_result;
      if ((int)LVar16.m_result < (int)LVar15.m_result) {
        DVar20 = LVar15.m_result;
      }
      if ((int)DVar20 <= (int)LVar17.m_result) {
        DVar20 = LVar17.m_result;
      }
      if ((int)DVar20 < 1) {
        DVar20 = LOAD_OK;
      }
      if (DVar20 <= DVar22) {
        DVar20 = DVar22;
      }
      _Var3._M_head_impl =
           (this->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      local_48 = (_Base_ptr)(local_68 + 8);
      local_68._8_4_ = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_48;
      local_58 = auVar8 << 0x40;
      local_40 = 0;
      local_a8 = (undefined1  [8])local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_,
                 DAT_013b1e58 + DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_);
      p_Var13 = (_Base_ptr)auStack_78;
      local_88 = p_Var13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,DBKeys::ACTIVEINTERNALSPK_abi_cxx11_,
                 DAT_013b1e78 + DBKeys::ACTIVEINTERNALSPK_abi_cxx11_);
      lVar21 = 0;
      DVar12 = LOAD_OK;
      do {
        local_d8._8_8_ = (string *)(local_a8 + lVar21);
        local_d8._0_8_ = local_68;
        local_c8._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
             ::_M_invoke;
        local_c8._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
             ::_M_manager;
        LVar15 = LoadRecords(pwallet,_Var3._M_head_impl,(string *)(local_a8 + lVar21),
                             (LoadFunc *)local_d8);
        if ((_Manager_type)local_c8._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_c8._0_8_)((_Any_data *)local_d8,(_Any_data *)local_d8,__destroy_functor);
        }
        if ((int)DVar12 <= (int)LVar15.m_result) {
          DVar12 = LVar15.m_result;
        }
        lVar21 = lVar21 + 0x20;
      } while (lVar21 != 0x40);
      lVar21 = -0x40;
      do {
        if (p_Var13 != p_Var13[-1]._M_left) {
          operator_delete(p_Var13[-1]._M_left,*(long *)p_Var13 + 1);
        }
        p_Var13 = p_Var13 + -1;
        lVar21 = lVar21 + 0x20;
      } while (lVar21 != 0);
      std::
      _Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
                   *)local_68);
      if ((int)DVar20 < (int)DVar12) {
        DVar20 = DVar12;
      }
      _local_a8 = (_Any_data)0x0;
      local_98._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
           ::_M_invoke;
      local_98._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
           ::_M_manager;
      LVar15 = LoadRecords(pwallet,(this->m_batch)._M_t.
                                   super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                                   .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>.
                                   _M_head_impl,(string *)&DBKeys::MASTER_KEY_abi_cxx11_,
                           (LoadFunc *)local_a8);
      if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_98._0_8_)(local_a8,local_a8,3);
      }
      DVar12 = LVar15.m_result;
      if ((int)LVar15.m_result < (int)DVar20) {
        DVar12 = DVar20;
      }
      if (DVar12 == LOAD_OK) {
        uVar19 = local_258._8_8_;
        if (local_258._0_8_ != local_258._8_8_) {
          __k = (key_type *)local_258._0_8_;
          do {
            iVar18 = std::
                     _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(pwallet->mapWallet)._M_h,__k);
            if (iVar18.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur == (__node_type *)0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00c3bdec;
              uVar19 = std::__throw_out_of_range("_Map_base::at");
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)local_68);
              std::
              _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
              ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                           *)local_a8);
              __cxa_begin_catch(uVar19);
              DVar12 = CORRUPT;
              __cxa_end_catch();
              goto LAB_00c3b6ea;
            }
            WriteTx(this,(CWalletTx *)
                         ((long)iVar18.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x28));
            __k = __k + 1;
          } while (__k != (key_type *)uVar19);
        }
        if (!bVar9 || local_25c != 0x46c6c) {
          DatabaseBatch::Write<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DBKeys::VERSION_abi_cxx11_,&CLIENT_VERSION,true);
        }
        DVar12 = LOAD_OK;
        if (local_239 == '\x01') {
          DVar12 = CWallet::ReorderTransactions(pwallet);
        }
        CWallet::UpgradeKeyMetadata(pwallet);
        CWallet::UpgradeDescriptorCache(pwallet);
      }
    }
  }
LAB_00c3b6ea:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b8);
  if ((void *)local_258._0_8_ != (void *)0x0) {
    operator_delete((void *)local_258._0_8_,local_248 - local_258._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return DVar12;
  }
LAB_00c3bdec:
  __stack_chk_fail();
}

Assistant:

DBErrors WalletBatch::LoadWallet(CWallet* pwallet)
{
    DBErrors result = DBErrors::LOAD_OK;
    bool any_unordered = false;
    std::vector<uint256> upgraded_txs;

    LOCK(pwallet->cs_wallet);

    // Last client version to open this wallet
    int last_client = CLIENT_VERSION;
    bool has_last_client = m_batch->Read(DBKeys::VERSION, last_client);
    pwallet->WalletLogPrintf("Wallet file version = %d, last client version = %d\n", pwallet->GetVersion(), last_client);

    try {
        if ((result = LoadMinVersion(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

        // Load wallet flags, so they are known when processing other records.
        // The FLAGS key is absent during wallet creation.
        if ((result = LoadWalletFlags(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

#ifndef ENABLE_EXTERNAL_SIGNER
        if (pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
            pwallet->WalletLogPrintf("Error: External signer wallet being loaded without external signer support compiled\n");
            return DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED;
        }
#endif

        // Load legacy wallet keys
        result = std::max(LoadLegacyWalletRecords(pwallet, *m_batch, last_client), result);

        // Load descriptors
        result = std::max(LoadDescriptorWalletRecords(pwallet, *m_batch, last_client), result);
        // Early return if there are unknown descriptors. Later loading of ACTIVEINTERNALSPK and ACTIVEEXTERNALEXPK
        // may reference the unknown descriptor's ID which can result in a misleading corruption error
        // when in reality the wallet is simply too new.
        if (result == DBErrors::UNKNOWN_DESCRIPTOR) return result;

        // Load address book
        result = std::max(LoadAddressBookRecords(pwallet, *m_batch), result);

        // Load tx records
        result = std::max(LoadTxRecords(pwallet, *m_batch, upgraded_txs, any_unordered), result);

        // Load SPKMs
        result = std::max(LoadActiveSPKMs(pwallet, *m_batch), result);

        // Load decryption keys
        result = std::max(LoadDecryptionKeys(pwallet, *m_batch), result);
    } catch (...) {
        // Exceptions that can be ignored or treated as non-critical are handled by the individual loading functions.
        // Any uncaught exceptions will be caught here and treated as critical.
        result = DBErrors::CORRUPT;
    }

    // Any wallet corruption at all: skip any rewriting or
    // upgrading, we don't want to make it worse.
    if (result != DBErrors::LOAD_OK)
        return result;

    for (const uint256& hash : upgraded_txs)
        WriteTx(pwallet->mapWallet.at(hash));

    if (!has_last_client || last_client != CLIENT_VERSION) // Update
        m_batch->Write(DBKeys::VERSION, CLIENT_VERSION);

    if (any_unordered)
        result = pwallet->ReorderTransactions();

    // Upgrade all of the wallet keymetadata to have the hd master key id
    // This operation is not atomic, but if it fails, updated entries are still backwards compatible with older software
    try {
        pwallet->UpgradeKeyMetadata();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    // Upgrade all of the descriptor caches to cache the last hardened xpub
    // This operation is not atomic, but if it fails, only new entries are added so it is backwards compatible
    try {
        pwallet->UpgradeDescriptorCache();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    return result;
}